

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

char * __thiscall bloaty::Regex::_InternalParse(Regex *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  ArenaStringPtr *pAVar2;
  ArenaStringPtr *pAVar3;
  bool bVar4;
  char *field_name;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  byte *pbVar8;
  internal *this_00;
  string *psVar9;
  pair<const_char_*,_unsigned_int> pVar10;
  StringPiece str;
  byte *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  InternalMetadataWithArena *local_38;
  char *size;
  
  local_50 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  if (!bVar4) {
    local_40 = &this->replacement_;
    local_48 = &this->pattern_;
    local_38 = &this->_internal_metadata_;
    do {
      bVar1 = *local_50;
      uVar6 = (ulong)bVar1;
      pbVar8 = local_50 + 1;
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*pbVar8 * 0x80) - 0x80;
        uVar6 = (ulong)uVar5;
        if (-1 < (char)*pbVar8) {
          pbVar8 = local_50 + 2;
          goto LAB_00191564;
        }
        pVar10 = google::protobuf::internal::ReadTagFallback((char *)local_50,uVar5);
        local_50 = (byte *)pVar10.first;
        if (local_50 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
LAB_00191564:
        pVar10._8_8_ = uVar6;
        pVar10.first = (char *)pbVar8;
        local_50 = pbVar8;
      }
      pAVar3 = local_40;
      pAVar2 = local_48;
      pbVar8 = (byte *)pVar10.first;
      uVar5 = pVar10.second;
      field_name = (char *)(pVar10._8_8_ >> 3 & 0x1fffffff);
      if ((int)field_name == 2) {
        if ((char)pVar10.second != '\x12') goto LAB_0019166f;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        psVar9 = (this->replacement_).ptr_;
        if (psVar9 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (local_40,(string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar9 = pAVar3->ptr_;
          pbVar8 = local_50;
        }
        pbVar8 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                   (psVar9,(char *)pbVar8,ctx);
        this_00 = (internal *)(psVar9->_M_dataplus)._M_p;
        size = (char *)psVar9->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion")
          ;
        }
        pcVar7 = "bloaty.Regex.replacement";
LAB_0019165e:
        str.length_ = (stringpiece_ssize_type)pcVar7;
        str.ptr_ = size;
        google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
        local_50 = pbVar8;
      }
      else {
        if (((int)field_name == 1) && ((char)pVar10.second == '\n')) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          psVar9 = (this->pattern_).ptr_;
          if (psVar9 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
             ) {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_48,(string *)
                                &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            psVar9 = pAVar2->ptr_;
            pbVar8 = local_50;
          }
          pbVar8 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (psVar9,(char *)pbVar8,ctx);
          this_00 = (internal *)(psVar9->_M_dataplus)._M_p;
          size = (char *)psVar9->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"size_t to int conversion");
          }
          pcVar7 = "bloaty.Regex.pattern";
          goto LAB_0019165e;
        }
LAB_0019166f:
        if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
          return (char *)local_50;
        }
        local_50 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar5,local_38,(char *)pbVar8,ctx);
      }
      if (local_50 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_50;
}

Assistant:

const char* Regex::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string pattern = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_pattern(), ptr, ctx, "bloaty.Regex.pattern");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string replacement = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_replacement(), ptr, ctx, "bloaty.Regex.replacement");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}